

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

string * testing::internal::StringStreamToString(string *__return_storage_ptr__,stringstream *ss)

{
  long lVar1;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  std::__cxx11::stringbuf::str();
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (local_48 != 0) {
    lVar1 = 0;
    do {
      if (*(char *)((long)local_50 + lVar1) == '\0') {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      lVar1 = lVar1 + 1;
    } while (local_48 != lVar1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringStreamToString(::std::stringstream* ss) {
  const ::std::string& str = ss->str();
  const char* const start = str.c_str();
  const char* const end = start + str.length();

  std::string result;
  result.reserve(2 * (end - start));
  for (const char* ch = start; ch != end; ++ch) {
    if (*ch == '\0') {
      result += "\\0";  // Replaces NUL with "\\0";
    } else {
      result += *ch;
    }
  }

  return result;
}